

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_1::SyncObjectResetCase::provokeReset
          (SyncObjectResetCase *this,
          SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset)

{
  TestLog *this_00;
  MessageBuilder *this_01;
  ContextReset *pCVar1;
  MessageBuilder local_198;
  SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *local_18;
  SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset_local;
  SyncObjectResetCase *this_local;
  
  local_18 = contextReset;
  contextReset_local = (SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *)this;
  this_00 = tcu::TestContext::getLog
                      ((this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.
                       super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_198,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<
                      (&local_198,
                       (char (*) [103])
                       "Check the status of a sync object after a context reset returned by glGetSynciv() equals GL_SIGNALED\n\n"
                      );
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  pCVar1 = de::SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset>::operator->(local_18);
  (*pCVar1->_vptr_ContextReset[2])();
  pCVar1 = de::SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset>::operator->(local_18);
  (*pCVar1->_vptr_ContextReset[3])();
  return;
}

Assistant:

virtual void provokeReset (de::SharedPtr<ContextReset>& contextReset)
	{
		m_testCtx.getLog()	<< tcu::TestLog::Message
							<< "Check the status of a sync object after a context reset returned by glGetSynciv() equals GL_SIGNALED\n\n"
							<< tcu::TestLog::EndMessage;

		contextReset->setup();
		contextReset->draw();
	}